

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

intptr_t absl::lts_20250127::IgnoreWaitingWritersMask(int flag)

{
  intptr_t iStack_10;
  int flag_local;
  
  if (flag < 0) {
    __assert_fail("flag >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                  ,0x71a,"intptr_t absl::IgnoreWaitingWritersMask(int)");
  }
  if (flag < 2) {
    if (flag == 0) {
      iStack_10 = -1;
    }
    else {
      if (flag != 1) {
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                      ,0x722,"intptr_t absl::IgnoreWaitingWritersMask(int)");
      }
      iStack_10 = -0x21;
    }
    return iStack_10;
  }
  __assert_fail("flag <= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                ,0x71b,"intptr_t absl::IgnoreWaitingWritersMask(int)");
}

Assistant:

static intptr_t IgnoreWaitingWritersMask(int flag) {
  assert(flag >= 0);
  assert(flag <= 1);
  switch (flag) {
    case 0:  // not blocked
      return ~static_cast<intptr_t>(0);
    case 1:  // blocked; pretend there are no waiting writers
      return ~static_cast<intptr_t>(kMuWrWait);
  }
  ABSL_UNREACHABLE();
}